

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O0

void wabt::WriteS64Leb128(Stream *stream,uint64_t value,char *desc)

{
  long value_00;
  char *desc_local;
  uint64_t value_local;
  Stream *stream_local;
  
  desc_local = (char *)value;
  value_local = (uint64_t)stream;
  value_00 = Bitcast<long,unsigned_long&>((unsigned_long *)&desc_local);
  WriteS64Leb128(stream,value_00,desc);
  return;
}

Assistant:

void WriteS64Leb128(Stream* stream, uint64_t value, const char* desc) {
  WriteS64Leb128(stream, Bitcast<int64_t>(value), desc);
}